

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_copy_propagation_elements.cpp
# Opt level: O3

ir_visitor_status __thiscall
anon_unknown.dwarf_905aa::ir_copy_propagation_elements_visitor::visit_leave
          (ir_copy_propagation_elements_visitor *this,ir_assignment *ir)

{
  ir_node_type iVar1;
  uint uVar2;
  ir_variable *piVar3;
  ir_dereference *piVar4;
  glsl_type *pgVar5;
  byte bVar6;
  int i;
  int iVar7;
  uint write_mask;
  undefined4 extraout_var;
  undefined1 (*pauVar8) [16];
  ir_variable *piVar9;
  ir_rvalue *piVar10;
  long lVar11;
  int i_1;
  uint uVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  int __sig;
  ir_rvalue *piVar13;
  ir_assignment *mem_ctx;
  uint uVar14;
  long lVar15;
  uint uVar16;
  uint local_48 [4];
  uint local_38 [6];
  
  iVar1 = (ir->lhs->super_ir_rvalue).super_ir_instruction.ir_type;
  mem_ctx = ir;
  iVar7 = (*(ir->lhs->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[8])();
  if ((((iVar1 == ir_type_dereference_variable) &&
       (lVar11 = *(long *)(CONCAT44(extraout_var,iVar7) + 0x20), 1 < *(byte *)(lVar11 + 8))) &&
      (*(char *)(lVar11 + 9) == '\x01')) && ((*(uint *)(lVar11 + 4) & 0xfc) < 0xc)) {
    pauVar8 = (undefined1 (*) [16])
              (anonymous_namespace)::kill_entry::operator_new((size_t)this->lin_ctx,mem_ctx);
    uVar12 = (byte)ir->field_0x38 & 0xf;
    __sig = extraout_EDX;
  }
  else {
    pauVar8 = (undefined1 (*) [16])
              (anonymous_namespace)::kill_entry::operator_new((size_t)this->lin_ctx,mem_ctx);
    uVar12 = 0xffffffff;
    __sig = extraout_EDX_00;
  }
  *pauVar8 = (undefined1  [16])0x0;
  *(long *)pauVar8[1] = CONCAT44(extraout_var,iVar7);
  *(uint *)(pauVar8[1] + 8) = uVar12;
  kill(this,(__pid_t)pauVar8,__sig);
  if (ir->condition == (ir_rvalue *)0x0) {
    piVar9 = ir_assignment::whole_variable_written(ir);
    piVar10 = ir->rhs;
    iVar1 = (piVar10->super_ir_instruction).ir_type;
    piVar13 = (ir_rvalue *)0x0;
    if (iVar1 == ir_type_dereference_variable) {
      piVar13 = piVar10;
    }
    if (((piVar9 == (ir_variable *)0x0) || (piVar13 == (ir_rvalue *)0x0)) ||
       (piVar3 = (ir_variable *)piVar13[1].super_ir_instruction._vptr_ir_instruction,
       piVar9 == piVar3 || piVar3 == (ir_variable *)0x0)) {
      piVar4 = ir->lhs;
      if ((piVar4 != (ir_dereference *)0x0) &&
         ((piVar4->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_dereference_variable)) {
        pgVar5 = (piVar4->super_ir_rvalue).type;
        if ((pgVar5->vector_elements == 1 && (*(uint *)&pgVar5->field_0x4 & 0xfe) < 0xe) ||
           ((*(uint *)&pgVar5->field_0x4 & 0xfc) < 0xc &&
            (pgVar5->matrix_columns == '\x01' && 1 < pgVar5->vector_elements))) {
          piVar9 = (ir_variable *)
                   piVar4[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction;
          uVar12 = *(uint *)&piVar9->data;
          if (((uVar12 & 0xe000) != 0x2000) &&
             ((iVar1 == ir_type_dereference_variable ||
              (((iVar1 == ir_type_swizzle &&
                (piVar10 = (ir_rvalue *)piVar10[1].super_ir_instruction._vptr_ir_instruction,
                piVar10 != (ir_rvalue *)0x0)) &&
               ((piVar10->super_ir_instruction).ir_type == ir_type_dereference_variable)))))) {
            piVar3 = (ir_variable *)piVar10[1].super_ir_instruction._vptr_ir_instruction;
            uVar2 = *(uint *)&piVar3->data;
            if ((uVar2 & 0xe000) != 0x2000) {
              uVar14 = (byte)ir->field_0x38 & 0xf;
              lVar11 = 0;
              iVar7 = 0;
              do {
                if ((uVar14 >> ((uint)lVar11 & 0x1f) & 1) != 0) {
                  lVar15 = (long)iVar7;
                  iVar7 = iVar7 + 1;
                  local_38[lVar11] = local_38[lVar15 + -4];
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 4);
              write_mask = uVar14;
              if (piVar9 == piVar3) {
                lVar11 = 0;
                do {
                  bVar6 = (byte)lVar11 & 0x1f;
                  uVar16 = -2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6;
                  if ((uVar14 >> (local_38[lVar11 + -4] & 0x1f) & 1) == 0) {
                    uVar16 = 0xffffffff;
                  }
                  write_mask = write_mask & uVar16;
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 4);
              }
              if (((uVar2 ^ uVar12) & 0x40) == 0) {
                copy_propagation_state::write_elements
                          (this->state,piVar9,piVar3,write_mask,(int *)local_38);
              }
            }
          }
        }
      }
    }
    else if ((((*(uint *)&piVar9->data & 0xe000) != 0x2000) &&
             ((*(uint *)&piVar3->data & 0xe000) != 0x2000)) &&
            (((*(uint *)&piVar3->data ^ *(uint *)&piVar9->data) & 0x40) == 0)) {
      copy_propagation_state::write_full(this->state,piVar9,piVar3);
    }
  }
  return visit_continue;
}

Assistant:

ir_visitor_status
ir_copy_propagation_elements_visitor::visit_leave(ir_assignment *ir)
{
   ir_dereference_variable *lhs = ir->lhs->as_dereference_variable();
   ir_variable *var = ir->lhs->variable_referenced();

   kill_entry *k;

   if (lhs && var->type->is_vector())
      k = new(this->lin_ctx) kill_entry(var, ir->write_mask);
   else
      k = new(this->lin_ctx) kill_entry(var, ~0);

   kill(k);

   add_copy(ir);

   return visit_continue;
}